

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delaunator.hpp
# Opt level: O1

void __thiscall
delaunator::Delaunator::Delaunator
          (Delaunator *this,vector<double,_std::allocator<double>_> *in_coords)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_01;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_02;
  double dVar1;
  double dVar2;
  pointer pdVar3;
  pointer puVar4;
  size_t i1;
  pointer puVar5;
  long lVar6;
  bool bVar7;
  _Iter_comp_iter<delaunator::compare> __comp;
  _Iter_comp_iter<delaunator::compare> __comp_00;
  undefined1 __first [8];
  double *pdVar8;
  ulong uVar9;
  size_type sVar10;
  ulong uVar11;
  unsigned_long uVar12;
  size_t sVar13;
  size_t sVar14;
  runtime_error *this_03;
  vector<double,_std::allocator<double>_> *pvVar15;
  ulong uVar16;
  vector<double,_std::allocator<double>_> *__n;
  vector<double,_std::allocator<double>_> *pvVar17;
  ulong uVar18;
  vector<double,_std::allocator<double>_> *pvVar19;
  vector<double,_std::allocator<double>_> *pvVar20;
  pointer puVar21;
  pointer i0;
  undefined4 uVar22;
  undefined4 uVar23;
  undefined4 uVar24;
  undefined4 uVar25;
  double dx;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dVar33;
  double dVar34;
  double dVar35;
  double dVar36;
  vector<double,_std::allocator<double>_> *local_d8;
  double dStack_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  undefined1 auStack_a8 [8];
  vector<unsigned_long,_std::allocator<unsigned_long>_> ids;
  double local_68;
  double local_60;
  double local_48;
  vector<double,_std::allocator<double>_> *local_38;
  
  this->coords = in_coords;
  this_00 = &this->hull_next;
  this_01 = &this->hull_tri;
  this_02 = &this->m_hash;
  memset(&this->triangles,0,200);
  puVar21 = (pointer)((long)(in_coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                            .super__Vector_impl_data._M_finish -
                      (long)(in_coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                            .super__Vector_impl_data._M_start >> 3);
  __n = (vector<double,_std::allocator<double>_> *)((ulong)puVar21 >> 1);
  auStack_a8 = (undefined1  [8])0x0;
  ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)auStack_a8,(size_type)__n);
  local_d8 = (vector<double,_std::allocator<double>_> *)0x0;
  if (puVar21 < (pointer)0x2) {
    dVar2 = 8.988465674311579e+307;
    dVar1 = dVar2;
  }
  else {
    local_38 = (vector<double,_std::allocator<double>_> *)0x10000000000000;
    local_60 = 2.2250738585072014e-308;
    local_48 = 1.79769313486232e+308;
    local_68 = 1.79769313486232e+308;
    do {
      pdVar3 = (this->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      pvVar19 = (vector<double,_std::allocator<double>_> *)pdVar3[(long)local_d8 * 2];
      dVar1 = pdVar3[(long)local_d8 * 2 + 1];
      if (ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start ==
          ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        std::vector<unsigned_long,std::allocator<unsigned_long>>::
        _M_realloc_insert<unsigned_long_const&>
                  ((vector<unsigned_long,std::allocator<unsigned_long>> *)auStack_a8,
                   (iterator)
                   ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start,(unsigned_long *)&local_d8);
      }
      else {
        *ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
         super__Vector_impl_data._M_start = (unsigned_long)local_d8;
        ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
        super__Vector_impl_data._M_start =
             ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start + 1;
      }
      uVar22 = SUB84(pvVar19,0);
      uVar24 = (undefined4)((ulong)pvVar19 >> 0x20);
      if (local_48 <= (double)pvVar19) {
        uVar22 = SUB84(local_48,0);
        uVar24 = (undefined4)((ulong)local_48 >> 0x20);
      }
      uVar23 = SUB84(dVar1,0);
      uVar25 = (undefined4)((ulong)dVar1 >> 0x20);
      if (local_68 <= dVar1) {
        uVar23 = SUB84(local_68,0);
        uVar25 = (undefined4)((ulong)local_68 >> 0x20);
      }
      if ((double)pvVar19 <= (double)local_38) {
        pvVar19 = local_38;
      }
      if (dVar1 <= local_60) {
        dVar1 = local_60;
      }
      local_d8 = (vector<double,_std::allocator<double>_> *)
                 ((long)&(local_d8->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + 1);
      local_48 = (double)CONCAT44(uVar24,uVar22);
      local_68 = (double)CONCAT44(uVar25,uVar23);
      local_60 = dVar1;
      local_38 = pvVar19;
    } while (local_d8 < __n);
    dVar2 = ((double)CONCAT44(uVar24,uVar22) + (double)pvVar19) * 0.5;
    dVar1 = ((double)CONCAT44(uVar25,uVar23) + dVar1) * 0.5;
  }
  puVar4 = ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  __first = auStack_a8;
  local_38 = (vector<double,_std::allocator<double>_> *)0xffffffffffffffff;
  pvVar19 = (vector<double,_std::allocator<double>_> *)0xffffffffffffffff;
  if ((pointer)0x1 < puVar21) {
    pdVar8 = (this->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start + 1;
    dVar26 = 1.79769313486232e+308;
    pvVar15 = (vector<double,_std::allocator<double>_> *)0x0;
    do {
      dVar28 = (dVar2 - pdVar8[-1]) * (dVar2 - pdVar8[-1]) + (dVar1 - *pdVar8) * (dVar1 - *pdVar8);
      pvVar20 = pvVar15;
      if (dVar26 <= dVar28) {
        dVar28 = dVar26;
        pvVar20 = pvVar19;
      }
      pvVar19 = pvVar20;
      dVar26 = dVar28;
      pvVar15 = (vector<double,_std::allocator<double>_> *)
                ((long)&(pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1);
      pdVar8 = pdVar8 + 2;
    } while (__n != pvVar15);
  }
  pvVar15 = this->coords;
  pdVar3 = (pvVar15->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start;
  dVar1 = pdVar3[(long)pvVar19 * 2];
  dVar2 = pdVar3[(long)pvVar19 * 2 + 1];
  if ((pointer)0x1 < puVar21) {
    pdVar8 = pdVar3 + 1;
    local_38 = (vector<double,_std::allocator<double>_> *)0xffffffffffffffff;
    dVar26 = 1.79769313486232e+308;
    pvVar20 = (vector<double,_std::allocator<double>_> *)0x0;
    do {
      if (((pvVar19 != pvVar20) &&
          (dVar28 = (dVar1 - pdVar8[-1]) * (dVar1 - pdVar8[-1]) +
                    (dVar2 - *pdVar8) * (dVar2 - *pdVar8), dVar28 < dVar26)) && (0.0 < dVar28)) {
        local_38 = pvVar20;
        dVar26 = dVar28;
      }
      pvVar20 = (vector<double,_std::allocator<double>_> *)
                ((long)&(pvVar20->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1);
      pdVar8 = pdVar8 + 2;
    } while (__n != pvVar20);
  }
  dVar26 = pdVar3[(long)local_38 * 2];
  dVar28 = pdVar3[(long)local_38 * 2 + 1];
  uVar22 = SUB84(dVar28,0);
  uVar24 = (undefined4)((ulong)dVar28 >> 0x20);
  if (puVar21 < (pointer)0x2) {
    pvVar20 = (vector<double,_std::allocator<double>_> *)0xffffffffffffffff;
    bVar7 = false;
  }
  else {
    dVar27 = dVar26 - dVar1;
    dVar29 = dVar28 - dVar2;
    dVar30 = dVar27 * dVar27 + dVar29 * dVar29;
    pdVar8 = pdVar3 + 1;
    pvVar20 = (vector<double,_std::allocator<double>_> *)0xffffffffffffffff;
    pvVar17 = (vector<double,_std::allocator<double>_> *)0x0;
    dVar33 = 1.79769313486232e+308;
    do {
      if (local_38 != pvVar17 && pvVar19 != pvVar17) {
        dVar34 = pdVar8[-1] - dVar1;
        dVar32 = *pdVar8 - dVar2;
        dVar36 = dVar27 * dVar32 + dVar34 * -dVar29;
        dVar31 = 1.79769313486232e+308;
        if (dVar36 != 0.0) {
          dVar35 = dVar34 * dVar34 + dVar32 * dVar32;
          dVar31 = ((dVar32 * dVar30 + dVar35 * -dVar29) * 0.5) / dVar36;
          dVar36 = ((dVar27 * dVar35 - dVar30 * dVar34) * 0.5) / dVar36;
          dVar31 = (double)(-(ulong)(dVar30 <= 0.0) & 0x7fefffffffffffff |
                           ~-(ulong)(dVar30 <= 0.0) &
                           (-(ulong)(dVar35 <= 0.0) & 0x7fefffffffffffff |
                           ~-(ulong)(dVar35 <= 0.0) & (ulong)(dVar31 * dVar31 + dVar36 * dVar36)));
        }
        if (dVar31 < dVar33) {
          pvVar20 = pvVar17;
          dVar33 = dVar31;
        }
      }
      pvVar17 = (vector<double,_std::allocator<double>_> *)
                ((long)&(pvVar17->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1);
      pdVar8 = pdVar8 + 2;
    } while (__n != pvVar17);
    bVar7 = dVar33 < 1.79769313486232e+308;
  }
  if (!bVar7) {
    this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_03,"not triangulation");
    __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  dVar33 = pdVar3[(long)pvVar20 * 2];
  local_c0 = pdVar3[(long)pvVar20 * 2 + 1];
  pvVar17 = pvVar20;
  local_b8 = dVar26;
  if (0.0 <= (dVar33 - dVar26) * (dVar28 - dVar2) - (local_c0 - dVar28) * (dVar26 - dVar1)) {
    uVar22 = SUB84(local_c0,0);
    uVar24 = (undefined4)((ulong)local_c0 >> 0x20);
    pvVar17 = local_38;
    local_b8 = dVar33;
    dVar33 = dVar26;
    local_c0 = dVar28;
    local_38 = pvVar20;
  }
  dVar30 = dVar33 - dVar1;
  dVar29 = local_c0 - dVar2;
  dVar27 = local_b8 - dVar1;
  local_b0 = (double)CONCAT44(uVar24,uVar22);
  dVar26 = (double)CONCAT44(uVar24,uVar22) - dVar2;
  dVar28 = dVar27 * dVar27 + dVar26 * dVar26;
  dVar31 = dVar30 * dVar30 + dVar29 * dVar29;
  dVar32 = dVar30 * dVar26 - dVar27 * dVar29;
  dStack_d0 = ((dVar26 * dVar31 - dVar29 * dVar28) * 0.5) / dVar32 + dVar1;
  local_c8 = ((dVar28 * dVar30 - dVar31 * dVar27) * 0.5) / dVar32 + dVar2;
  this->m_center_x = dStack_d0;
  this->m_center_y = local_c8;
  local_d8 = pvVar15;
  ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = puVar21;
  if (auStack_a8 !=
      (undefined1  [8])
      ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar9 = (long)ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                  super__Vector_impl_data._M_start - (long)auStack_a8 >> 3;
    lVar6 = 0x3f;
    if (uVar9 != 0) {
      for (; uVar9 >> lVar6 == 0; lVar6 = lVar6 + -1) {
      }
    }
    __comp._M_comp.cx = dStack_d0;
    __comp._M_comp.coords = pvVar15;
    __comp._M_comp.cy = local_c8;
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<delaunator::compare>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )auStack_a8,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                 super__Vector_impl_data._M_start,(ulong)(((uint)lVar6 ^ 0x3f) * 2) ^ 0x7e,__comp);
    __comp_00._M_comp.cx = dStack_d0;
    __comp_00._M_comp.coords = local_d8;
    __comp_00._M_comp.cy = local_c8;
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<unsigned_long*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,__gnu_cxx::__ops::_Iter_comp_iter<delaunator::compare>>
              ((__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )__first,
               (__normal_iterator<unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )puVar4,__comp_00);
  }
  dVar26 = (double)(long)__n;
  if (dVar26 < 0.0) {
    dVar26 = sqrt(dVar26);
  }
  else {
    dVar26 = SQRT(dVar26);
  }
  dVar26 = ceil(dVar26);
  sVar10 = llround(dVar26);
  this->m_hash_size = sVar10;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_02,sVar10);
  puVar21 = (this->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start;
  puVar4 = (this->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar21 != puVar4) {
    memset(puVar21,0xff,((long)puVar4 + (-8 - (long)puVar21) & 0xfffffffffffffff8U) + 8);
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (&this->hull_prev,(size_type)__n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_00,(size_type)__n);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize(this_01,(size_type)__n);
  this->hull_start = (size_t)pvVar19;
  puVar21 = (this->hull_prev).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar21[(long)local_38] = (unsigned_long)pvVar17;
  puVar4 = (this->hull_next).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar4[(long)pvVar19] = (unsigned_long)pvVar17;
  puVar21[(long)pvVar19] = (unsigned_long)local_38;
  puVar4[(long)pvVar17] = (unsigned_long)local_38;
  puVar21[(long)pvVar17] = (unsigned_long)pvVar19;
  puVar4[(long)local_38] = (unsigned_long)pvVar19;
  puVar21 = (this->hull_tri).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
            _M_impl.super__Vector_impl_data._M_start;
  puVar21[(long)pvVar19] = 0;
  puVar21[(long)pvVar17] = 1;
  puVar21[(long)local_38] = 2;
  dVar26 = dVar1 - this->m_center_x;
  dVar28 = dVar2 - this->m_center_y;
  dVar26 = dVar26 / (ABS(dVar28) + ABS(dVar26));
  uVar9 = -(ulong)(0.0 < dVar28);
  dVar26 = floor((((double)CONCAT44(0x45300000,(int)(this->m_hash_size >> 0x20)) -
                  1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)this->m_hash_size) - 4503599627370496.0)) *
                 (double)(~uVar9 & (ulong)(dVar26 + 1.0) | (ulong)(3.0 - dVar26) & uVar9) * 0.25);
  uVar9 = llround(dVar26);
  puVar21 = ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage;
  if (this->m_hash_size <= uVar9) {
    uVar9 = uVar9 % this->m_hash_size;
  }
  (this->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[uVar9] = (unsigned_long)pvVar19;
  dVar26 = dVar33 - this->m_center_x;
  dVar28 = local_c0 - this->m_center_y;
  uVar9 = -(ulong)(0.0 < dVar28);
  dVar26 = dVar26 / (ABS(dVar28) + ABS(dVar26));
  dVar26 = floor((((double)CONCAT44(0x45300000,(int)(this->m_hash_size >> 0x20)) -
                  1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)this->m_hash_size) - 4503599627370496.0)) *
                 (double)(~uVar9 & (ulong)(dVar26 + 1.0) | (ulong)(3.0 - dVar26) & uVar9) * 0.25);
  uVar9 = llround(dVar26);
  if (this->m_hash_size <= uVar9) {
    uVar9 = uVar9 % this->m_hash_size;
  }
  (this->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start[uVar9] = (unsigned_long)pvVar17;
  dVar26 = local_b8 - this->m_center_x;
  dVar28 = local_b0 - this->m_center_y;
  uVar9 = -(ulong)(0.0 < dVar28);
  dVar26 = dVar26 / (ABS(dVar28) + ABS(dVar26));
  dVar26 = floor((((double)CONCAT44(0x45300000,(int)(this->m_hash_size >> 0x20)) -
                  1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)this->m_hash_size) - 4503599627370496.0)) *
                 (double)(~uVar9 & (ulong)(dVar26 + 1.0) | (ulong)(3.0 - dVar26) & uVar9) * 0.25);
  uVar9 = llround(dVar26);
  if (this->m_hash_size <= uVar9) {
    uVar9 = uVar9 % this->m_hash_size;
  }
  (this_02->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_start[uVar9] = (unsigned_long)local_38;
  sVar10 = 3;
  if ((pointer)0x5 < puVar21) {
    sVar10 = ((ulong)puVar21 & 0xfffffffffffffffe) * 3 - 0xf;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&this->triangles,sVar10);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve(&this->halfedges,sVar10);
  add_triangle(this,(size_t)pvVar19,(size_t)pvVar17,(size_t)local_38,0xffffffffffffffff,
               0xffffffffffffffff,0xffffffffffffffff);
  if ((pointer)0x1 < puVar21) {
    uVar23 = 0;
    uVar25 = 0x7ff80000;
    pvVar19 = (vector<double,_std::allocator<double>_> *)0x0;
    uVar22 = uVar23;
    uVar24 = uVar25;
    do {
      i1 = *(size_t *)((long)auStack_a8 + pvVar19 * 8);
      pdVar3 = (this->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      dVar26 = pdVar3[i1 * 2];
      dVar28 = pdVar3[i1 * 2 + 1];
      if (((pvVar19 == (vector<double,_std::allocator<double>_> *)0x0) ||
          (2.220446049250313e-16 < ABS(dVar26 - (double)CONCAT44(uVar24,uVar22)))) ||
         (2.220446049250313e-16 < ABS(dVar28 - (double)CONCAT44(uVar25,uVar23)))) {
        uVar23 = SUB84(dVar28,0);
        uVar25 = (undefined4)((ulong)dVar28 >> 0x20);
        uVar22 = SUB84(dVar26,0);
        uVar24 = (undefined4)((ulong)dVar26 >> 0x20);
        if (((2.220446049250313e-16 < ABS(dVar26 - dVar1)) ||
            (2.220446049250313e-16 < ABS(dVar28 - dVar2))) &&
           (((2.220446049250313e-16 < ABS(dVar26 - dVar33) ||
             (2.220446049250313e-16 < ABS(dVar28 - local_c0))) &&
            ((2.220446049250313e-16 < ABS(dVar26 - local_b8) ||
             (2.220446049250313e-16 < ABS(dVar28 - local_b0))))))) {
          dVar27 = dVar26 - this->m_center_x;
          dVar29 = dVar28 - this->m_center_y;
          uVar9 = -(ulong)(0.0 < dVar29);
          dVar27 = dVar27 / (ABS(dVar29) + ABS(dVar27));
          dVar27 = floor((((double)CONCAT44(0x45300000,(int)(this->m_hash_size >> 0x20)) -
                          1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)this->m_hash_size) - 4503599627370496.0))
                         * (double)(~uVar9 & (ulong)(dVar27 + 1.0) | (ulong)(3.0 - dVar27) & uVar9)
                           * 0.25);
          uVar11 = llround(dVar27);
          uVar9 = this->m_hash_size;
          if (uVar9 <= uVar11) {
            uVar11 = uVar11 % uVar9;
          }
          if (uVar9 == 0) {
            uVar12 = 0;
          }
          else {
            uVar18 = 0;
            do {
              uVar16 = uVar18 + uVar11;
              if (uVar9 <= uVar16) {
                uVar16 = uVar16 % uVar9;
              }
              uVar12 = (this_02->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_start[uVar16];
            } while (((uVar12 == 0xffffffffffffffff) ||
                     (uVar12 == (this_00->
                                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                                _M_impl.super__Vector_impl_data._M_start[uVar12])) &&
                    (uVar18 = uVar18 + 1, uVar18 < uVar9));
          }
          puVar21 = (pointer)(this->hull_prev).
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                             _M_impl.super__Vector_impl_data._M_start[uVar12];
          puVar4 = (this->hull_next).
                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar3 = (this->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          i0 = puVar21;
          do {
            puVar5 = (pointer)puVar4[(long)i0];
            if ((pdVar3[(long)puVar5 * 2] - pdVar3[(long)i0 * 2]) *
                (pdVar3[(long)i0 * 2 + 1] - dVar28) -
                (pdVar3[(long)puVar5 * 2 + 1] - pdVar3[(long)i0 * 2 + 1]) *
                (pdVar3[(long)i0 * 2] - dVar26) < 0.0) goto LAB_00109595;
            i0 = puVar5;
          } while (puVar5 != puVar21);
          i0 = (pointer)0xffffffffffffffff;
LAB_00109595:
          if (i0 != (pointer)0xffffffffffffffff) {
            ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = puVar21;
            sVar13 = add_triangle(this,(size_t)i0,i1,puVar4[(long)i0],0xffffffffffffffff,
                                  0xffffffffffffffff,
                                  (this->hull_tri).
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start[(long)i0]);
            sVar14 = legalize(this,sVar13 + 2);
            puVar21 = (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start;
            puVar21[i1] = sVar14;
            puVar21[(long)i0] = sVar13;
            uVar12 = (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                     _M_impl.super__Vector_impl_data._M_start[(long)i0];
            while( true ) {
              sVar13 = (this->hull_next).
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                       super__Vector_impl_data._M_start[uVar12];
              pdVar3 = (this->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if (0.0 <= (pdVar3[sVar13 * 2] - pdVar3[uVar12 * 2]) *
                         (pdVar3[uVar12 * 2 + 1] - dVar28) -
                         (pdVar3[sVar13 * 2 + 1] - pdVar3[uVar12 * 2 + 1]) *
                         (pdVar3[uVar12 * 2] - dVar26)) break;
              puVar21 = (this->hull_tri).
                        super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                        super__Vector_impl_data._M_start;
              sVar14 = add_triangle(this,uVar12,i1,sVar13,puVar21[i1],0xffffffffffffffff,
                                    puVar21[uVar12]);
              sVar14 = legalize(this,sVar14 + 2);
              (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[i1] = sVar14;
              (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
              super__Vector_impl_data._M_start[uVar12] = uVar12;
              uVar12 = sVar13;
            }
            if (i0 == ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
              while( true ) {
                puVar21 = (pointer)(this->hull_prev).
                                   super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>
                                   ._M_impl.super__Vector_impl_data._M_start[(long)i0];
                pdVar3 = (this->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl
                         .super__Vector_impl_data._M_start;
                if (0.0 <= (pdVar3[(long)i0 * 2] - pdVar3[(long)puVar21 * 2]) *
                           (pdVar3[(long)puVar21 * 2 + 1] - dVar28) -
                           (pdVar3[(long)i0 * 2 + 1] - pdVar3[(long)puVar21 * 2 + 1]) *
                           (pdVar3[(long)puVar21 * 2] - dVar26)) break;
                puVar4 = (this->hull_tri).
                         super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                         super__Vector_impl_data._M_start;
                sVar13 = add_triangle(this,(size_t)puVar21,i1,(size_t)i0,0xffffffffffffffff,
                                      puVar4[(long)i0],puVar4[(long)puVar21]);
                legalize(this,sVar13 + 2);
                (this_01->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start[(long)puVar21] = sVar13;
                (this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                .super__Vector_impl_data._M_start[(long)i0] = (unsigned_long)i0;
                i0 = puVar21;
              }
            }
            puVar21 = (this->hull_prev).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar21[i1] = (unsigned_long)i0;
            this->hull_start = (size_t)i0;
            puVar21[uVar12] = i1;
            puVar21 = (this->hull_next).
                      super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                      super__Vector_impl_data._M_start;
            puVar21[(long)i0] = i1;
            puVar21[i1] = uVar12;
            dVar26 = dVar26 - this->m_center_x;
            dVar28 = dVar28 - this->m_center_y;
            uVar9 = -(ulong)(0.0 < dVar28);
            dVar26 = dVar26 / (ABS(dVar28) + ABS(dVar26));
            dVar26 = floor((((double)CONCAT44(0x45300000,(int)(this->m_hash_size >> 0x20)) -
                            1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)this->m_hash_size) - 4503599627370496.0
                           )) * (double)(~uVar9 & (ulong)(dVar26 + 1.0) |
                                        (ulong)(3.0 - dVar26) & uVar9) * 0.25);
            uVar9 = llround(dVar26);
            if (this->m_hash_size <= uVar9) {
              uVar9 = uVar9 % this->m_hash_size;
            }
            (this->m_hash).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
            .super__Vector_impl_data._M_start[uVar9] = i1;
            pdVar3 = (this->coords->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            dVar26 = pdVar3[(long)i0 * 2] - this->m_center_x;
            dVar28 = pdVar3[(long)i0 * 2 + 1] - this->m_center_y;
            uVar9 = -(ulong)(0.0 < dVar28);
            dVar26 = dVar26 / (ABS(dVar28) + ABS(dVar26));
            dVar26 = floor((((double)CONCAT44(0x45300000,(int)(this->m_hash_size >> 0x20)) -
                            1.9342813113834067e+25) +
                           ((double)CONCAT44(0x43300000,(int)this->m_hash_size) - 4503599627370496.0
                           )) * (double)(~uVar9 & (ulong)(dVar26 + 1.0) |
                                        (ulong)(3.0 - dVar26) & uVar9) * 0.25);
            uVar9 = llround(dVar26);
            if (this->m_hash_size <= uVar9) {
              uVar9 = uVar9 % this->m_hash_size;
            }
            (this_02->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar9] = (unsigned_long)i0;
          }
        }
      }
      pvVar19 = (vector<double,_std::allocator<double>_> *)
                ((long)&(pvVar19->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                        super__Vector_impl_data._M_start + 1);
    } while (pvVar19 != __n);
  }
  if (auStack_a8 != (undefined1  [8])0x0) {
    operator_delete((void *)auStack_a8,
                    (long)ids.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)auStack_a8);
  }
  return;
}

Assistant:

Delaunator::Delaunator(std::vector<double> const& in_coords)
    : coords(in_coords),
      triangles(),
      halfedges(),
      hull_prev(),
      hull_next(),
      hull_tri(),
      hull_start(),
      m_hash(),
      m_center_x(),
      m_center_y(),
      m_hash_size(),
      m_edge_stack() {
    std::size_t n = coords.size() >> 1;

    double max_x = std::numeric_limits<double>::min();
    double max_y = std::numeric_limits<double>::min();
    double min_x = std::numeric_limits<double>::max();
    double min_y = std::numeric_limits<double>::max();
    std::vector<std::size_t> ids;
    ids.reserve(n);

    for (std::size_t i = 0; i < n; i++) {
        const double x = coords[2 * i];
        const double y = coords[2 * i + 1];

        if (x < min_x) min_x = x;
        if (y < min_y) min_y = y;
        if (x > max_x) max_x = x;
        if (y > max_y) max_y = y;

        ids.push_back(i);
    }
    const double cx = (min_x + max_x) / 2;
    const double cy = (min_y + max_y) / 2;
    double min_dist = std::numeric_limits<double>::max();

    std::size_t i0 = INVALID_INDEX;
    std::size_t i1 = INVALID_INDEX;
    std::size_t i2 = INVALID_INDEX;

    // pick a seed point close to the centroid
    for (std::size_t i = 0; i < n; i++) {
        const double d = dist(cx, cy, coords[2 * i], coords[2 * i + 1]);
        if (d < min_dist) {
            i0 = i;
            min_dist = d;
        }
    }

    const double i0x = coords[2 * i0];
    const double i0y = coords[2 * i0 + 1];

    min_dist = std::numeric_limits<double>::max();

    // find the point closest to the seed
    for (std::size_t i = 0; i < n; i++) {
        if (i == i0) continue;
        const double d = dist(i0x, i0y, coords[2 * i], coords[2 * i + 1]);
        if (d < min_dist && d > 0.0) {
            i1 = i;
            min_dist = d;
        }
    }

    double i1x = coords[2 * i1];
    double i1y = coords[2 * i1 + 1];

    double min_radius = std::numeric_limits<double>::max();

    // find the third point which forms the smallest circumcircle with the first two
    for (std::size_t i = 0; i < n; i++) {
        if (i == i0 || i == i1) continue;

        const double r = circumradius(
            i0x, i0y, i1x, i1y, coords[2 * i], coords[2 * i + 1]);

        if (r < min_radius) {
            i2 = i;
            min_radius = r;
        }
    }

    if (!(min_radius < std::numeric_limits<double>::max())) {
        throw std::runtime_error("not triangulation");
    }

    double i2x = coords[2 * i2];
    double i2y = coords[2 * i2 + 1];

    if (orient(i0x, i0y, i1x, i1y, i2x, i2y)) {
        std::swap(i1, i2);
        std::swap(i1x, i2x);
        std::swap(i1y, i2y);
    }

    std::tie(m_center_x, m_center_y) = circumcenter(i0x, i0y, i1x, i1y, i2x, i2y);

    // sort the points by distance from the seed triangle circumcenter
    std::sort(ids.begin(), ids.end(), compare{ coords, m_center_x, m_center_y });

    // initialize a hash table for storing edges of the advancing convex hull
    m_hash_size = static_cast<std::size_t>(std::llround(std::ceil(std::sqrt(n))));
    m_hash.resize(m_hash_size);
    std::fill(m_hash.begin(), m_hash.end(), INVALID_INDEX);

    // initialize arrays for tracking the edges of the advancing convex hull
    hull_prev.resize(n);
    hull_next.resize(n);
    hull_tri.resize(n);

    hull_start = i0;

    size_t hull_size = 3;

    hull_next[i0] = hull_prev[i2] = i1;
    hull_next[i1] = hull_prev[i0] = i2;
    hull_next[i2] = hull_prev[i1] = i0;

    hull_tri[i0] = 0;
    hull_tri[i1] = 1;
    hull_tri[i2] = 2;

    m_hash[hash_key(i0x, i0y)] = i0;
    m_hash[hash_key(i1x, i1y)] = i1;
    m_hash[hash_key(i2x, i2y)] = i2;

    std::size_t max_triangles = n < 3 ? 1 : 2 * n - 5;
    triangles.reserve(max_triangles * 3);
    halfedges.reserve(max_triangles * 3);
    add_triangle(i0, i1, i2, INVALID_INDEX, INVALID_INDEX, INVALID_INDEX);
    double xp = std::numeric_limits<double>::quiet_NaN();
    double yp = std::numeric_limits<double>::quiet_NaN();
    for (std::size_t k = 0; k < n; k++) {
        const std::size_t i = ids[k];
        const double x = coords[2 * i];
        const double y = coords[2 * i + 1];

        // skip near-duplicate points
        if (k > 0 && check_pts_equal(x, y, xp, yp)) continue;
        xp = x;
        yp = y;

        // skip seed triangle points
        if (
            check_pts_equal(x, y, i0x, i0y) ||
            check_pts_equal(x, y, i1x, i1y) ||
            check_pts_equal(x, y, i2x, i2y)) continue;

        // find a visible edge on the convex hull using edge hash
        std::size_t start = 0;

        size_t key = hash_key(x, y);
        for (size_t j = 0; j < m_hash_size; j++) {
            start = m_hash[fast_mod(key + j, m_hash_size)];
            if (start != INVALID_INDEX && start != hull_next[start]) break;
        }

        start = hull_prev[start];
        size_t e = start;
        size_t q;

        while (q = hull_next[e], !orient(x, y, coords[2 * e], coords[2 * e + 1], coords[2 * q], coords[2 * q + 1])) { //TODO: does it works in a same way as in JS
            e = q;
            if (e == start) {
                e = INVALID_INDEX;
                break;
            }
        }

        if (e == INVALID_INDEX) continue; // likely a near-duplicate point; skip it

        // add the first triangle from the point
        std::size_t t = add_triangle(
            e,
            i,
            hull_next[e],
            INVALID_INDEX,
            INVALID_INDEX,
            hull_tri[e]);

        hull_tri[i] = legalize(t + 2);
        hull_tri[e] = t;
        hull_size++;

        // walk forward through the hull, adding more triangles and flipping recursively
        std::size_t next = hull_next[e];
        while (
            q = hull_next[next],
            orient(x, y, coords[2 * next], coords[2 * next + 1], coords[2 * q], coords[2 * q + 1])) {
            t = add_triangle(next, i, q, hull_tri[i], INVALID_INDEX, hull_tri[next]);
            hull_tri[i] = legalize(t + 2);
            hull_next[next] = next; // mark as removed
            hull_size--;
            next = q;
        }

        // walk backward from the other side, adding more triangles and flipping
        if (e == start) {
            while (
                q = hull_prev[e],
                orient(x, y, coords[2 * q], coords[2 * q + 1], coords[2 * e], coords[2 * e + 1])) {
                t = add_triangle(q, i, e, INVALID_INDEX, hull_tri[e], hull_tri[q]);
                legalize(t + 2);
                hull_tri[q] = t;
                hull_next[e] = e; // mark as removed
                hull_size--;
                e = q;
            }
        }

        // update the hull indices
        hull_prev[i] = e;
        hull_start = e;
        hull_prev[next] = i;
        hull_next[e] = i;
        hull_next[i] = next;

        m_hash[hash_key(x, y)] = i;
        m_hash[hash_key(coords[2 * e], coords[2 * e + 1])] = e;
    }
}